

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void read_svc_vui_parameters_extension(sps_svc_ext_t *sps_svc_ext,bs_t *b)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  uint32_t r_1;
  short sVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  _Bool _Var12;
  
  pbVar2 = b->p;
  pbVar1 = b->end;
  uVar7 = b->bits_left;
  uVar3 = 0xffffffff;
  iVar6 = 0;
  do {
    uVar7 = uVar7 - 1;
    b->bits_left = uVar7;
    bVar11 = true;
    if (pbVar2 < pbVar1) {
      bVar11 = (*pbVar2 >> (uVar7 & 0x1f) & 1) == 0;
    }
    if (uVar7 == 0) {
      pbVar2 = pbVar2 + 1;
      b->p = pbVar2;
      b->bits_left = 8;
      uVar7 = 8;
    }
    uVar3 = uVar3 + 1;
    iVar6 = iVar6 + -1;
  } while (((bool)(bVar11 & uVar3 < 0x20)) && (pbVar2 < pbVar1));
  if (iVar6 == -1) {
    sVar5 = 0;
  }
  else {
    iVar4 = -2 - iVar6;
    iVar8 = -3 - iVar6;
    uVar7 = b->bits_left;
    pbVar2 = b->p;
    uVar3 = 0;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      uVar9 = 0;
      if (pbVar2 < pbVar1) {
        uVar9 = (uint)((*pbVar2 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar3 = uVar3 | uVar9 << ((byte)iVar4 & 0x1f);
      sVar5 = (short)uVar3;
      iVar8 = iVar8 + -1;
      iVar4 = iVar4 + -1;
    } while (iVar8 != -2);
  }
  (sps_svc_ext->vui).vui_ext_num_entries_minus1 = ~(ushort)(-1 << (~(byte)iVar6 & 0x1f)) + sVar5;
  uVar10 = 0;
  do {
    pbVar2 = b->p;
    uVar7 = b->bits_left;
    iVar6 = 2;
    uVar3 = 0;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      uVar9 = 0;
      if (pbVar2 < b->end) {
        uVar9 = (uint)((*pbVar2 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar3 = uVar3 | uVar9 << ((byte)iVar6 & 0x1f);
      bVar11 = iVar6 != 0;
      iVar6 = iVar6 + -1;
    } while (bVar11);
    (sps_svc_ext->vui).vui_ext_dependency_id[uVar10] = (uchar)uVar3;
    pbVar2 = b->p;
    uVar7 = b->bits_left;
    uVar3 = 0;
    iVar6 = 3;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      uVar9 = 0;
      if (pbVar2 < b->end) {
        uVar9 = (uint)((*pbVar2 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar3 = uVar3 | uVar9 << ((byte)iVar6 & 0x1f);
      bVar11 = iVar6 != 0;
      iVar6 = iVar6 + -1;
    } while (bVar11);
    (sps_svc_ext->vui).vui_ext_quality_id[uVar10] = (uchar)uVar3;
    pbVar2 = b->p;
    uVar7 = b->bits_left;
    uVar3 = 0;
    iVar6 = 2;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      uVar9 = 0;
      if (pbVar2 < b->end) {
        uVar9 = (uint)((*pbVar2 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar3 = uVar3 | uVar9 << ((byte)iVar6 & 0x1f);
      bVar11 = iVar6 != 0;
      iVar6 = iVar6 + -1;
    } while (bVar11);
    (sps_svc_ext->vui).vui_ext_temporal_id[uVar10] = (uchar)uVar3;
    uVar7 = b->bits_left - 1;
    b->bits_left = uVar7;
    pbVar2 = b->p;
    bVar11 = false;
    if (pbVar2 < b->end) {
      bVar11 = (*pbVar2 >> (uVar7 & 0x1f) & 1) != 0;
    }
    if (uVar7 == 0) {
      b->p = pbVar2 + 1;
      b->bits_left = 8;
    }
    (sps_svc_ext->vui).vui_ext_timing_info_present_flag[uVar10] = bVar11;
    if (bVar11) {
      pbVar2 = b->p;
      pbVar1 = b->end;
      uVar7 = b->bits_left;
      uVar3 = 0;
      iVar6 = 0x1f;
      do {
        uVar7 = uVar7 - 1;
        b->bits_left = uVar7;
        uVar9 = 0;
        if (pbVar2 < pbVar1) {
          uVar9 = (uint)((*pbVar2 >> (uVar7 & 0x1f) & 1) != 0);
        }
        if (uVar7 == 0) {
          pbVar2 = pbVar2 + 1;
          b->p = pbVar2;
          b->bits_left = 8;
          uVar7 = 8;
        }
        uVar3 = uVar3 | uVar9 << ((byte)iVar6 & 0x1f);
        bVar11 = iVar6 != 0;
        iVar6 = iVar6 + -1;
      } while (bVar11);
      (sps_svc_ext->vui).vui_ext_num_units_in_tick[uVar10] = uVar3;
      uVar7 = b->bits_left;
      pbVar2 = b->p;
      uVar3 = 0;
      iVar6 = 0x1f;
      do {
        uVar7 = uVar7 - 1;
        b->bits_left = uVar7;
        uVar9 = 0;
        if (pbVar2 < pbVar1) {
          uVar9 = (uint)((*pbVar2 >> (uVar7 & 0x1f) & 1) != 0);
        }
        if (uVar7 == 0) {
          pbVar2 = pbVar2 + 1;
          b->p = pbVar2;
          b->bits_left = 8;
          uVar7 = 8;
        }
        uVar3 = uVar3 | uVar9 << ((byte)iVar6 & 0x1f);
        bVar11 = iVar6 != 0;
        iVar6 = iVar6 + -1;
      } while (bVar11);
      (sps_svc_ext->vui).vui_ext_time_scale[uVar10] = uVar3;
      uVar7 = b->bits_left - 1;
      b->bits_left = uVar7;
      pbVar2 = b->p;
      if (pbVar2 < pbVar1) {
        _Var12 = (*pbVar2 >> (uVar7 & 0x1f) & 1) != 0;
      }
      else {
        _Var12 = false;
      }
      if (uVar7 == 0) {
        b->p = pbVar2 + 1;
        b->bits_left = 8;
      }
      (sps_svc_ext->vui).vui_ext_fixed_frame_rate_flag[uVar10] = _Var12;
    }
    uVar7 = b->bits_left - 1;
    b->bits_left = uVar7;
    pbVar2 = b->p;
    bVar11 = false;
    if (pbVar2 < b->end) {
      bVar11 = (*pbVar2 >> (uVar7 & 0x1f) & 1) != 0;
    }
    if (uVar7 == 0) {
      b->p = pbVar2 + 1;
      b->bits_left = 8;
    }
    (sps_svc_ext->vui).vui_ext_nal_hrd_parameters_present_flag[uVar10] = bVar11;
    if (bVar11) {
      read_hrd_parameters(sps_svc_ext->hrd_vcl + uVar10,b);
    }
    uVar7 = b->bits_left - 1;
    b->bits_left = uVar7;
    pbVar2 = b->p;
    bVar11 = false;
    if (pbVar2 < b->end) {
      bVar11 = (*pbVar2 >> (uVar7 & 0x1f) & 1) != 0;
    }
    if (uVar7 == 0) {
      b->p = pbVar2 + 1;
      b->bits_left = 8;
    }
    (sps_svc_ext->vui).vui_ext_vcl_hrd_parameters_present_flag[uVar10] = bVar11;
    if (bVar11) {
      read_hrd_parameters(sps_svc_ext->hrd_nal + uVar10,b);
    }
    if (((sps_svc_ext->vui).vui_ext_nal_hrd_parameters_present_flag[uVar10] != false) ||
       ((sps_svc_ext->vui).vui_ext_vcl_hrd_parameters_present_flag[uVar10] == true)) {
      uVar7 = b->bits_left - 1;
      b->bits_left = uVar7;
      pbVar2 = b->p;
      if (pbVar2 < b->end) {
        _Var12 = (*pbVar2 >> (uVar7 & 0x1f) & 1) != 0;
      }
      else {
        _Var12 = false;
      }
      if (uVar7 == 0) {
        b->p = pbVar2 + 1;
        b->bits_left = 8;
      }
      (sps_svc_ext->vui).vui_ext_low_delay_hrd_flag[uVar10] = _Var12;
    }
    uVar7 = b->bits_left - 1;
    b->bits_left = uVar7;
    pbVar2 = b->p;
    if (pbVar2 < b->end) {
      _Var12 = (*pbVar2 >> (uVar7 & 0x1f) & 1) != 0;
    }
    else {
      _Var12 = false;
    }
    if (uVar7 == 0) {
      b->p = pbVar2 + 1;
      b->bits_left = 8;
    }
    (sps_svc_ext->vui).vui_ext_pic_struct_present_flag[uVar10] = _Var12;
    bVar11 = uVar10 < (sps_svc_ext->vui).vui_ext_num_entries_minus1;
    uVar10 = uVar10 + 1;
  } while (bVar11);
  return;
}

Assistant:

void read_svc_vui_parameters_extension(sps_svc_ext_t* sps_svc_ext, bs_t* b)
{
    sps_svc_ext->vui.vui_ext_num_entries_minus1 = bs_read_ue(b);
    for( int i = 0; i <= sps_svc_ext->vui.vui_ext_num_entries_minus1; i++ )
    {
        sps_svc_ext->vui.vui_ext_dependency_id[i] = bs_read_u(b, 3);
        sps_svc_ext->vui.vui_ext_quality_id[i] = bs_read_u(b, 4);
        sps_svc_ext->vui.vui_ext_temporal_id[i] = bs_read_u(b, 3);
        sps_svc_ext->vui.vui_ext_timing_info_present_flag[i] = bs_read_u1(b);
        if( sps_svc_ext->vui.vui_ext_timing_info_present_flag[i] )
        {
            sps_svc_ext->vui.vui_ext_num_units_in_tick[i] = bs_read_u(b, 32);
            sps_svc_ext->vui.vui_ext_time_scale[i] = bs_read_u(b, 32);
            sps_svc_ext->vui.vui_ext_fixed_frame_rate_flag[i] = bs_read_u1(b);
        }

        sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] = bs_read_u1(b);
        if( sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] )
        {
            read_hrd_parameters(&sps_svc_ext->hrd_vcl[i], b);
        }
        sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] = bs_read_u1(b);
        if( sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] )
        {
            read_hrd_parameters(&sps_svc_ext->hrd_nal[i], b);
        }
        
        if( sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] ||
            sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] )
        {
            sps_svc_ext->vui.vui_ext_low_delay_hrd_flag[i] = bs_read_u1(b);
        }
        sps_svc_ext->vui.vui_ext_pic_struct_present_flag[i] = bs_read_u1(b);
    }
}